

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_union_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  ushort uVar1;
  void *pvVar2;
  ushort uVar3;
  int iVar4;
  flatbuffers_utype_t fVar5;
  ulong uVar6;
  flatbuffers_uoffset_t base;
  uint local_4c;
  flatcc_union_verifier_descriptor_t local_48;
  
  uVar3 = id * 2 + 2;
  uVar1 = td->vsize;
  if (uVar3 < uVar1) {
    uVar3 = *(ushort *)((long)td->vtable + (ulong)uVar3);
    uVar6 = (ulong)uVar3;
    if (uVar6 != 0) {
      if (td->tsize <= uVar3) {
        return 0xd;
      }
      pvVar2 = td->buf;
      uVar3 = id * 2 + 4;
      if (uVar3 < uVar1) {
        fVar5 = *(flatbuffers_utype_t *)((long)pvVar2 + uVar6 + td->table);
        if ((fVar5 == '\0') && (*(short *)((long)td->vtable + (ulong)uVar3) != 0)) {
          return 0x18;
        }
      }
      else {
        fVar5 = *(flatbuffers_utype_t *)((long)pvVar2 + uVar6 + td->table);
      }
      if (fVar5 == '\0') {
        return 0;
      }
      iVar4 = get_offset_field(td,id,required,&local_4c);
      if (local_4c == 0 || iVar4 != 0) {
        return iVar4;
      }
      local_48.end = td->end;
      local_48.ttl = td->ttl;
      local_48.base = local_4c;
      local_48.offset = *(flatbuffers_uoffset_t *)((long)pvVar2 + (ulong)local_4c);
      local_48.buf = pvVar2;
      local_48.type = fVar5;
      iVar4 = (*uvf)(&local_48);
      return iVar4;
    }
  }
  uVar3 = id * 2 + 4;
  if (((uVar1 <= uVar3) || (iVar4 = 0x17, *(short *)((long)td->vtable + (ulong)uVar3) == 0)) &&
     (iVar4 = 0x15, required == 0)) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int flatcc_verify_union_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uint8_t *type;
    uoffset_t base;
    flatcc_union_verifier_descriptor_t ud;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        vte_table = read_vt_entry(td, id);
        verify(vte_table == 0, flatcc_verify_error_union_cannot_have_a_table_without_a_type);
        verify(!required, flatcc_verify_error_type_field_absent_from_required_union_field);
        return flatcc_verify_ok;
    }
    /* No need to check required here. */
    check_result(verify_field(td, id - 1, 0, 1, 1));
    /* Only now is it safe to read the type. */
    vte_table = read_vt_entry(td, id);
    type = (const uint8_t *)td->buf + td->table + vte_type;
    verify(*type || vte_table == 0, flatcc_verify_error_union_type_NONE_cannot_have_a_value);

    if (*type == 0) {
        return flatcc_verify_ok;
    }
    check_field(td, id, required, base);
    ud.buf = td->buf;
    ud.end = td->end;
    ud.ttl = td->ttl;
    ud.base = base;
    ud.offset = read_uoffset(td->buf, base);
    ud.type = *type;
    return uvf(&ud);
}